

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

string * vkt::shaderexecutor::anon_unknown_0::generateGeometryShader
                   (string *__return_storage_ptr__,ShaderSpec *shaderSpec,string *inputPrefix,
                   string *outputPrefix)

{
  bool bVar1;
  DataType DVar2;
  int vecSize_00;
  ulong uVar3;
  ostream *poVar4;
  pointer pSVar5;
  istream *piVar6;
  pointer pSVar7;
  char *pcVar8;
  DataType local_6d4;
  DataType local_5d4;
  DataType intBaseType_1;
  int vecSize_1;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_558;
  const_iterator output_2;
  string line;
  istringstream opSrc;
  DeclareVariable local_3b0;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_370;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_368;
  const_iterator output_1;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_320;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_318;
  const_iterator input_1;
  DeclareVariable local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  DeclareVariable local_290;
  undefined1 local_250 [8];
  VarType intType;
  DataType intBaseType;
  int vecSize;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_228;
  const_iterator output;
  DeclareVariable local_200;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_1c0;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_1b8;
  const_iterator input;
  int locationNumber;
  ostringstream local_1a0 [8];
  ostringstream src;
  string *outputPrefix_local;
  string *inputPrefix_local;
  ShaderSpec *shaderSpec_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,
                  "#version 310 es\n#extension GL_EXT_geometry_shader : require\n");
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)local_1a0,(string *)&shaderSpec->globalDeclarations);
    std::operator<<(poVar4,"\n");
  }
  poVar4 = std::operator<<((ostream *)local_1a0,"layout(points) in;\n");
  std::operator<<(poVar4,"layout(points, max_vertices = 1) out;\n");
  input._M_current._0_4_ = 0;
  local_1b8._M_current =
       (Symbol *)
       std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::begin
                 (&shaderSpec->inputs);
  while( true ) {
    local_1c0._M_current =
         (Symbol *)
         std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::end
                   (&shaderSpec->inputs);
    bVar1 = __gnu_cxx::operator!=(&local_1b8,&local_1c0);
    if (!bVar1) break;
    poVar4 = std::operator<<((ostream *)local_1a0,"layout(location = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)input._M_current);
    poVar4 = std::operator<<(poVar4,") flat in ");
    pSVar7 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_1b8);
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_1b8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output,
                   inputPrefix,&pSVar5->name);
    glu::declare(&local_200,&pSVar7->varType,(string *)&output,0);
    poVar4 = glu::decl::operator<<(poVar4,&local_200);
    std::operator<<(poVar4,"[];\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_200);
    std::__cxx11::string::~string((string *)&output);
    __gnu_cxx::
    __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
    ::operator++(&local_1b8);
    input._M_current._0_4_ = (int)input._M_current + 1;
  }
  input._M_current._0_4_ = 0;
  local_228._M_current =
       (Symbol *)
       std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::begin
                 (&shaderSpec->outputs);
  while( true ) {
    _intBaseType = std::
                   vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                   ::end(&shaderSpec->outputs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_228,
                       (__normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
                        *)&intBaseType);
    if (!bVar1) break;
    pSVar7 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_228);
    DVar2 = glu::VarType::getBasicType(&pSVar7->varType);
    bVar1 = glu::isDataTypeBoolOrBVec(DVar2);
    if (bVar1) {
      pSVar7 = __gnu_cxx::
               __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
               ::operator->(&local_228);
      DVar2 = glu::VarType::getBasicType(&pSVar7->varType);
      intType.m_data._12_4_ = glu::getDataTypeScalarSize(DVar2);
      if ((int)intType.m_data._12_4_ < 2) {
        local_5d4 = TYPE_INT;
      }
      else {
        local_5d4 = glu::getDataTypeIntVec(intType.m_data._12_4_);
      }
      intType.m_data.array.size = local_5d4;
      glu::VarType::VarType((VarType *)local_250,local_5d4,PRECISION_HIGHP);
      poVar4 = std::operator<<((ostream *)local_1a0,"layout(location = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)input._M_current);
      poVar4 = std::operator<<(poVar4,") flat out ");
      pSVar7 = __gnu_cxx::
               __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
               ::operator->(&local_228);
      std::operator+(&local_2b0,outputPrefix,&pSVar7->name);
      glu::declare(&local_290,(VarType *)local_250,&local_2b0,0);
      poVar4 = glu::decl::operator<<(poVar4,&local_290);
      std::operator<<(poVar4,";\n");
      glu::decl::DeclareVariable::~DeclareVariable(&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      glu::VarType::~VarType((VarType *)local_250);
    }
    else {
      poVar4 = std::operator<<((ostream *)local_1a0,"layout(location = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)input._M_current);
      poVar4 = std::operator<<(poVar4,") flat out ");
      pSVar7 = __gnu_cxx::
               __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
               ::operator->(&local_228);
      pSVar5 = __gnu_cxx::
               __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
               ::operator->(&local_228);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input_1,
                     outputPrefix,&pSVar5->name);
      glu::declare(&local_2f0,&pSVar7->varType,(string *)&input_1,0);
      poVar4 = glu::decl::operator<<(poVar4,&local_2f0);
      std::operator<<(poVar4,";\n");
      glu::decl::DeclareVariable::~DeclareVariable(&local_2f0);
      std::__cxx11::string::~string((string *)&input_1);
    }
    __gnu_cxx::
    __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
    ::operator++(&local_228);
    input._M_current._0_4_ = (int)input._M_current + 1;
  }
  poVar4 = std::operator<<((ostream *)local_1a0,"\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  std::operator<<(poVar4,"\tgl_Position = gl_in[0].gl_Position;\n\n");
  local_318._M_current =
       (Symbol *)
       std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::begin
                 (&shaderSpec->inputs);
  while( true ) {
    local_320._M_current =
         (Symbol *)
         std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::end
                   (&shaderSpec->inputs);
    bVar1 = __gnu_cxx::operator!=(&local_318,&local_320);
    if (!bVar1) break;
    poVar4 = std::operator<<((ostream *)local_1a0,"\t");
    pSVar7 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_318);
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_318);
    glu::declare((DeclareVariable *)&output_1,&pSVar7->varType,&pSVar5->name,0);
    poVar4 = glu::decl::operator<<(poVar4,(DeclareVariable *)&output_1);
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = std::operator<<(poVar4,(string *)inputPrefix);
    pSVar7 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_318);
    poVar4 = std::operator<<(poVar4,(string *)pSVar7);
    std::operator<<(poVar4,"[0];\n");
    glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&output_1);
    __gnu_cxx::
    __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
    ::operator++(&local_318);
  }
  local_368._M_current =
       (Symbol *)
       std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::begin
                 (&shaderSpec->outputs);
  while( true ) {
    local_370._M_current =
         (Symbol *)
         std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::end
                   (&shaderSpec->outputs);
    bVar1 = __gnu_cxx::operator!=(&local_368,&local_370);
    if (!bVar1) break;
    poVar4 = std::operator<<((ostream *)local_1a0,"\t");
    pSVar7 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_368);
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_368);
    glu::declare(&local_3b0,&pSVar7->varType,&pSVar5->name,0);
    poVar4 = glu::decl::operator<<(poVar4,&local_3b0);
    std::operator<<(poVar4,";\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_3b0);
    __gnu_cxx::
    __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
    ::operator++(&local_368);
  }
  std::operator<<((ostream *)local_1a0,"\n");
  std::__cxx11::istringstream::istringstream
            ((istringstream *)(line.field_2._M_local_buf + 8),(string *)&shaderSpec->source,_S_in);
  std::__cxx11::string::string((string *)&output_2);
  while( true ) {
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(line.field_2._M_local_buf + 8),(string *)&output_2);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
    if (!bVar1) break;
    poVar4 = std::operator<<((ostream *)local_1a0,"\t");
    poVar4 = std::operator<<(poVar4,(string *)&output_2);
    std::operator<<(poVar4,"\n");
  }
  std::__cxx11::string::~string((string *)&output_2);
  std::__cxx11::istringstream::~istringstream((istringstream *)(line.field_2._M_local_buf + 8));
  local_558._M_current =
       (Symbol *)
       std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::begin
                 (&shaderSpec->outputs);
  while( true ) {
    _intBaseType_1 =
         std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::end
                   (&shaderSpec->outputs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_558,
                       (__normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
                        *)&intBaseType_1);
    if (!bVar1) break;
    pSVar7 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_558);
    DVar2 = glu::VarType::getBasicType(&pSVar7->varType);
    bVar1 = glu::isDataTypeBoolOrBVec(DVar2);
    if (bVar1) {
      pSVar7 = __gnu_cxx::
               __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
               ::operator->(&local_558);
      DVar2 = glu::VarType::getBasicType(&pSVar7->varType);
      vecSize_00 = glu::getDataTypeScalarSize(DVar2);
      if (vecSize_00 < 2) {
        local_6d4 = TYPE_INT;
      }
      else {
        local_6d4 = glu::getDataTypeIntVec(vecSize_00);
      }
      poVar4 = std::operator<<((ostream *)local_1a0,"\t");
      poVar4 = std::operator<<(poVar4,(string *)outputPrefix);
      pSVar7 = __gnu_cxx::
               __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
               ::operator->(&local_558);
      poVar4 = std::operator<<(poVar4,(string *)pSVar7);
      poVar4 = std::operator<<(poVar4," = ");
      pcVar8 = glu::getDataTypeName(local_6d4);
      poVar4 = std::operator<<(poVar4,pcVar8);
      poVar4 = std::operator<<(poVar4,"(");
      pSVar7 = __gnu_cxx::
               __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
               ::operator->(&local_558);
      poVar4 = std::operator<<(poVar4,(string *)pSVar7);
      std::operator<<(poVar4,");\n");
    }
    else {
      poVar4 = std::operator<<((ostream *)local_1a0,"\t");
      poVar4 = std::operator<<(poVar4,(string *)outputPrefix);
      pSVar7 = __gnu_cxx::
               __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
               ::operator->(&local_558);
      poVar4 = std::operator<<(poVar4,(string *)pSVar7);
      poVar4 = std::operator<<(poVar4," = ");
      pSVar7 = __gnu_cxx::
               __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
               ::operator->(&local_558);
      poVar4 = std::operator<<(poVar4,(string *)pSVar7);
      std::operator<<(poVar4,";\n");
    }
    __gnu_cxx::
    __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
    ::operator++(&local_558);
  }
  poVar4 = std::operator<<((ostream *)local_1a0,"\tEmitVertex();\n");
  poVar4 = std::operator<<(poVar4,"\tEndPrimitive();\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static std::string generateGeometryShader (const ShaderSpec& shaderSpec, const std::string& inputPrefix, const std::string& outputPrefix)
{
	DE_ASSERT(!inputPrefix.empty() && !outputPrefix.empty());

	std::ostringstream	src;

	src <<	"#version 310 es\n"
		"#extension GL_EXT_geometry_shader : require\n";

	if (!shaderSpec.globalDeclarations.empty())
		src << shaderSpec.globalDeclarations << "\n";

	src << "layout(points) in;\n"
		<< "layout(points, max_vertices = 1) out;\n";

	int locationNumber = 0;
	for (vector<Symbol>::const_iterator input = shaderSpec.inputs.begin(); input != shaderSpec.inputs.end(); ++input, ++locationNumber)
		src << "layout(location = " << locationNumber << ") flat in " << glu::declare(input->varType, inputPrefix + input->name) << "[];\n";

	locationNumber = 0;
	for (vector<Symbol>::const_iterator output = shaderSpec.outputs.begin(); output != shaderSpec.outputs.end(); ++output, ++locationNumber)
	{
		DE_ASSERT(output->varType.isBasicType());

		if (glu::isDataTypeBoolOrBVec(output->varType.getBasicType()))
		{
			const int				vecSize		= glu::getDataTypeScalarSize(output->varType.getBasicType());
			const glu::DataType		intBaseType	= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::VarType		intType		(intBaseType, glu::PRECISION_HIGHP);

			src << "layout(location = " << locationNumber << ") flat out " << glu::declare(intType, outputPrefix + output->name) << ";\n";
		}
		else
			src << "layout(location = " << locationNumber << ") flat out " << glu::declare(output->varType, outputPrefix + output->name) << ";\n";
	}

	src << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = gl_in[0].gl_Position;\n\n";

	// Fetch input variables
	for (vector<Symbol>::const_iterator input = shaderSpec.inputs.begin(); input != shaderSpec.inputs.end(); ++input)
		src << "\t" << glu::declare(input->varType, input->name) << " = " << inputPrefix << input->name << "[0];\n";

	// Declare local output variables.
	for (vector<Symbol>::const_iterator output = shaderSpec.outputs.begin(); output != shaderSpec.outputs.end(); ++output)
		src << "\t" << glu::declare(output->varType, output->name) << ";\n";

	src << "\n";

	// Operation - indented to correct level.
	{
		std::istringstream	opSrc	(shaderSpec.source);
		std::string			line;

		while (std::getline(opSrc, line))
			src << "\t" << line << "\n";
	}

	// Assignments to outputs.
	for (vector<Symbol>::const_iterator output = shaderSpec.outputs.begin(); output != shaderSpec.outputs.end(); ++output)
	{
		if (glu::isDataTypeBoolOrBVec(output->varType.getBasicType()))
		{
			const int				vecSize		= glu::getDataTypeScalarSize(output->varType.getBasicType());
			const glu::DataType		intBaseType	= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;

			src << "\t" << outputPrefix << output->name << " = " << glu::getDataTypeName(intBaseType) << "(" << output->name << ");\n";
		}
		else
			src << "\t" << outputPrefix << output->name << " = " << output->name << ";\n";
	}

	src << "	EmitVertex();\n"
		<< "	EndPrimitive();\n"
		<< "}\n";

	return src.str();
}